

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O0

__pid_t __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_so_5::disp::adv_thread_pool::disp_params_t>
::wait(proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_so_5::disp::adv_thread_pool::disp_params_t>
       *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  pointer peVar1;
  proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_so_5::disp::adv_thread_pool::disp_params_t>
  *this_local;
  
  peVar1 = std::
           unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
           ::operator->(&this->m_disp);
  (*(peVar1->super_dispatcher_t)._vptr_dispatcher_t[4])();
  std::
  unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
  ::reset(&this->m_disp,(pointer)0x0);
  return extraout_EAX;
}

Assistant:

virtual void
		wait() override
			{
				m_disp->wait();

				m_disp.reset();
			}